

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

bool Imath_3_2::checkForZeroScaleInRow<float>(float *scl,Vec3<float> *row,bool exc)

{
  domain_error *this;
  ulong uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = *scl;
  if (fVar3 <= -fVar3) {
    fVar3 = -fVar3;
  }
  uVar1 = 0;
  bVar2 = false;
  do {
    if (fVar3 < 1.0) {
      fVar4 = (&row->x)[uVar1];
      if (fVar4 <= -fVar4) {
        fVar4 = -fVar4;
      }
      if (fVar3 * 3.4028235e+38 <= fVar4) {
        if (!exc) {
          return bVar2;
        }
        this = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error(this,"Cannot remove zero scaling from matrix.");
        __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    bVar2 = 1 < uVar1;
    uVar1 = uVar1 + 1;
    if (uVar1 == 3) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool
checkForZeroScaleInRow (const T& scl, const Vec3<T>& row, bool exc /* = true */)
{
    for (int i = 0; i < 3; i++)
    {
        if ((abs (scl) < 1 &&
             abs (row[i]) >= std::numeric_limits<T>::max () * abs (scl)))
        {
            if (exc)
                throw std::domain_error ("Cannot remove zero scaling "
                                         "from matrix.");
            else
                return false;
        }
    }

    return true;
}